

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomHelper.h
# Opt level: O2

Subject * GetRandom<Subject>(vector<Subject,_std::allocator<Subject>_> *vec)

{
  result_type_conflict1 rVar1;
  uniform_int_distribution<int> distribution;
  
  distribution._M_param =
       (param_type)
       ((ulong)((int)(((long)(vec->super__Vector_base<Subject,_std::allocator<Subject>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(vec->super__Vector_base<Subject,_std::allocator<Subject>_>)._M_impl.
                            super__Vector_impl_data._M_start) / 0x38) - 1) << 0x20);
  random_engine();
  rVar1 = std::uniform_int_distribution<int>::operator()(&distribution,&random_engine::smt);
  return (vec->super__Vector_base<Subject,_std::allocator<Subject>_>)._M_impl.
         super__Vector_impl_data._M_start + rVar1;
}

Assistant:

static const T& GetRandom(const vector<T>& vec) {
    uniform_int_distribution<int> distribution(0, vec.size() - 1);
    size_t randomPos = distribution(random_engine());
    return vec[randomPos];
}